

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O3

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinSCANL_X,void>::
eval_exc_<int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinSCANL_X,void> *this,int *args,double **args_1,
          double **args_2,double **args_3,double **args_4,double **args_5)

{
  double *eps;
  uint N;
  const_host_buffer_type rho;
  const_host_buffer_type sigma;
  host_buffer_type eps_00;
  long lVar1;
  double sigma_00;
  double dVar2;
  double dStack_58;
  const_host_buffer_type pdStack_50;
  double dStack_48;
  double dStack_40;
  double dStack_38;
  
  N = *args;
  rho = *args_1;
  sigma = *args_2;
  pdStack_50 = *args_3;
  eps_00 = *args_5;
  if (*(int *)(this + 8) == 0) {
    host_eval_exc_helper_polar<ExchCXX::BuiltinSCANL_X>(N,rho,sigma,pdStack_50,*args_4,eps_00);
    return;
  }
  if (0 < (int)N) {
    lVar1 = 0;
    do {
      dStack_48 = *(double *)((long)rho + lVar1);
      eps = (double *)((long)eps_00 + lVar1);
      if (dStack_48 <= 1e-15) {
        *eps = 0.0;
      }
      else {
        dStack_38 = *(double *)((long)pdStack_50 + lVar1);
        dVar2 = *(double *)((long)sigma + lVar1);
        dStack_40 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= dVar2) {
          dStack_40 = dVar2;
        }
        kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_unpolar_impl
                  (dStack_48,dStack_40,dStack_38,0.0,&dStack_58);
        dStack_58 = dStack_58 * dStack_48;
        dVar2 = 1e-20;
        if (1e-20 <= dStack_58) {
          dVar2 = dStack_58;
        }
        sigma_00 = dStack_48 * 8.0 * dVar2;
        if (dStack_40 <= sigma_00) {
          sigma_00 = dStack_40;
        }
        kernel_traits<ExchCXX::BuiltinSCAN_X>::eval_exc_unpolar_impl
                  (dStack_48,sigma_00,dStack_38,dVar2,eps);
      }
      lVar1 = lVar1 + 8;
    } while ((ulong)N << 3 != lVar1);
  }
  return;
}

Assistant:

void eval_exc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }